

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReaderCache::~PtexReaderCache(PtexReaderCache *this)

{
  ~PtexReaderCache(this);
  operator_delete(this,0x4d0);
  return;
}

Assistant:

~PtexReaderCache()
    {}